

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastV8R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  TcFieldData TVar10;
  ParseContext *pPVar11;
  undefined7 uVar12;
  ParseContext *extraout_RDX;
  RepeatedField<bool> *this;
  ushort *puVar13;
  ushort *puVar14;
  uint *puVar15;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  this = (RepeatedField<bool> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar3 = *(ushort *)ptr;
  pPVar11 = ctx;
  puVar13 = (ushort *)ptr;
  while( true ) {
    puVar14 = (ushort *)((long)puVar13 + 3);
    bVar1 = (byte)puVar13[1];
    uVar12 = (undefined7)((ulong)pPVar11 >> 8);
    uVar7 = (uint)CONCAT71(uVar12,bVar1);
    if (1 < bVar1) {
      bVar5 = 1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)((long)puVar13 + 3);
        TVar10.field_0._1_7_ = (undefined7)((ulong)puVar14 >> 8);
        bVar5 = bVar1 & 0x7f | bVar2;
        if ((char)bVar2 < '\0') {
          bVar6 = bVar1 & 0x7f | bVar2 & 0x7f;
          bVar2 = (byte)puVar13[2];
          bVar5 = bVar6 | bVar2;
          if ((char)bVar2 < '\0') {
            bVar6 = bVar6 | bVar2 & 0x7f;
            bVar2 = *(byte *)((long)puVar13 + 5);
            bVar5 = bVar6 | bVar2;
            if ((char)bVar2 < '\0') {
              bVar6 = bVar6 | bVar2 & 0x7f;
              bVar2 = (byte)puVar13[3];
              bVar5 = bVar6 | bVar2;
              if ((char)bVar2 < '\0') {
                bVar6 = bVar6 | bVar2 & 0x7f;
                bVar2 = *(byte *)((long)puVar13 + 7);
                bVar5 = bVar6 | bVar2;
                if ((char)bVar2 < '\0') {
                  bVar6 = bVar6 | bVar2 & 0x7f;
                  bVar2 = (byte)puVar13[4];
                  bVar5 = bVar6 | bVar2;
                  if ((char)bVar2 < '\0') {
                    bVar6 = bVar6 | bVar2 & 0x7f;
                    bVar2 = *(byte *)((long)puVar13 + 9);
                    bVar5 = bVar6 | bVar2;
                    if ((char)bVar2 < '\0') {
                      bVar6 = bVar6 | bVar2 & 0x7f;
                      bVar2 = (byte)puVar13[5];
                      bVar5 = bVar6 | bVar2;
                      if ((char)bVar2 < '\0') {
                        bVar5 = *(byte *)((long)puVar13 + 0xb);
                        TVar10.field_0.data._0_1_ = bVar5;
                        if ((char)bVar5 < '\0') {
                          pcVar9 = Error(msg,ptr,(ParseContext *)
                                                 (CONCAT71(uVar12,bVar1) & 0xffffffffffffff7f),
                                         TVar10,table,hasbits);
                          return pcVar9;
                        }
                        puVar14 = puVar13 + 6;
                        bVar5 = bVar6 | bVar2 & 0x7f | bVar5 & 0x81;
                      }
                      else {
                        puVar14 = (ushort *)((long)puVar13 + 0xb);
                      }
                    }
                    else {
                      puVar14 = puVar13 + 5;
                    }
                  }
                  else {
                    puVar14 = (ushort *)((long)puVar13 + 9);
                  }
                }
                else {
                  puVar14 = puVar13 + 4;
                }
              }
              else {
                puVar14 = (ushort *)((long)puVar13 + 7);
              }
            }
            else {
              puVar14 = puVar13 + 3;
            }
          }
          else {
            puVar14 = (ushort *)((long)puVar13 + 5);
          }
        }
        else {
          puVar14 = puVar13 + 2;
        }
      }
      uVar7 = (uint)(bVar5 != 0);
    }
    ptr = (char *)(ulong)(uVar7 & 1);
    RepeatedField<bool>::Add(this,SUB41(uVar7 & 1,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar14) break;
    uVar4 = *puVar14;
    pPVar11 = extraout_RDX;
    puVar13 = puVar14;
    if (uVar4 != uVar3) {
      uVar7 = (uint)table->fast_idx_mask & (uint)uVar4;
      if ((uVar7 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar8 = (ulong)(uVar7 & 0xfffffff8);
      pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                 (msg,puVar14,ctx,
                                  (ulong)uVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),
                                  table,hasbits);
      return pcVar9;
    }
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar15 & 3) != 0) {
      AlignFail(puVar15);
    }
    *puVar15 = *puVar15 | (uint)hasbits;
  }
  return (char *)puVar14;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}